

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O0

void __thiscall libserver::server::handle_client(server *this)

{
  bool bVar1;
  int in_ESI;
  server *this_local;
  
  _read_from_socket(this);
  _process_request_(this);
  bVar1 = _is_timed_out(this);
  if (bVar1) {
    _exit(this,in_ESI);
  }
  return;
}

Assistant:

void libserver::server::handle_client()
{
    /* 
        Main sequential client handler
        Reads from socket
        Processes the message read
    */
    // TODO: Handle errors in reading
    _read_from_socket();
    _process_request_();
    if (_is_timed_out())
    {
        _exit();
    }
}